

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O3

void lanli_unescape_html(lanli_buffer *ob,uint8_t *data,size_t size)

{
  html_entity *phVar1;
  void *pvVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t *str;
  uint c;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  bool bVar10;
  
  uVar4 = 0;
  do {
    uVar5 = uVar4;
    if (uVar4 < size) {
      bVar10 = true;
      uVar6 = uVar4;
      if (data[uVar4] != '&') {
        do {
          uVar5 = size;
          if (size - 1 == uVar6) goto LAB_00122ef1;
          uVar5 = uVar6 + 1;
          lVar8 = uVar6 + 1;
          uVar6 = uVar5;
        } while (data[lVar8] != '&');
        bVar10 = uVar5 < size;
      }
    }
    else {
LAB_00122ef1:
      if (uVar4 == 0) {
        lanli_buffer_put(ob,data,size);
        return;
      }
      bVar10 = false;
    }
    if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
      lanli_buffer_put(ob,data + uVar4,uVar5 - uVar4);
    }
    if (!bVar10) {
      return;
    }
    str = data + uVar5 + 1;
    uVar4 = size - (uVar5 + 1);
    if (uVar4 < 4) {
      bVar10 = uVar4 == 3;
      uVar4 = 3;
      if (bVar10) goto LAB_00122fb5;
LAB_001230d0:
      lanli_buffer_putc(ob,'&');
LAB_001230de:
      lVar8 = 0;
    }
    else {
      if (*str != '#') {
        if (0x1e < uVar4) {
          uVar4 = 0x1f;
        }
LAB_00122fb5:
        uVar6 = 2;
        do {
          if (data[uVar6 + uVar5 + 1] == ' ') break;
          if (data[uVar6 + uVar5 + 1] == ';') {
            phVar1 = find_entity((char *)str,(uint)uVar6);
            if (phVar1 != (html_entity *)0x0) {
              lanli_buffer_put(ob,phVar1->utf8,phVar1->size);
              goto LAB_001230cb;
            }
            break;
          }
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
        goto LAB_001230d0;
      }
      if ((byte)(data[uVar5 + 2] - 0x30) < 10) {
        uVar6 = 1;
        c = 0;
        do {
          if (9 < (byte)(data[uVar6 + uVar5 + 1] - 0x30)) goto LAB_001230b3;
          c = ((uint)data[uVar6 + uVar5 + 1] + c * 10) - 0x30;
          lVar8 = (2 - size) + uVar5 + uVar6;
          uVar6 = uVar6 + 1;
        } while (lVar8 != 0);
        goto LAB_001230d0;
      }
      if ((data[uVar5 + 2] | 0x20) == 0x78) {
        uVar7 = 2;
        c = 0;
        do {
          bVar9 = data[uVar7 + uVar5 + 1];
          pvVar2 = memchr("0123456789ABCDEFabcdef",(uint)bVar9,0x17);
          uVar6 = uVar7;
          if (pvVar2 == (void *)0x0) break;
          bVar9 = bVar9 | 0x20;
          cVar3 = (char)((uint)bVar9 * 0xa5 >> 8);
          c = (c * 0x10 +
              (uint)(byte)(bVar9 + ((byte)(((byte)(bVar9 - cVar3) >> 1) + cVar3) >> 5) * -0x27)) - 9
          ;
          lVar8 = (3 - size) + uVar5 + uVar7;
          uVar7 = uVar7 + 1;
          uVar6 = uVar4;
        } while (lVar8 != 1);
        if (uVar6 != 2) goto LAB_001230b3;
        goto LAB_001230de;
      }
      uVar6 = 0;
      c = 0;
LAB_001230b3:
      if ((uVar4 <= uVar6) || (str[uVar6] != ';')) goto LAB_001230d0;
      lanli_buffer_put_utf8(ob,c);
LAB_001230cb:
      lVar8 = uVar6 + 1;
    }
    uVar4 = lVar8 + uVar5 + 1;
  } while( true );
}

Assistant:

void lanli_unescape_html(lanli_buffer *ob, const uint8_t *data, size_t size) {
  size_t i = 0, mark;

  while (1) {
    mark = i;
    while (i < size && data[i] != '&') i++;

    /* Optimization for cases where there's nothing to escape */
    if (mark == 0 && i >= size) {
      lanli_buffer_put(ob, data, size);
      return;
    }

    if (likely(i > mark))
      lanli_buffer_put(ob, data + mark, i - mark);

    if (i >= size) break;

    i++;
    i += unescape_entity(ob, data + i, size - i);
  }
}